

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::InnerProduct_x86_avx512::forward_fp16s
          (InnerProduct_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 (*in_RCX) [64];
  long *in_RDX;
  undefined8 *in_RSI;
  long *in_RDI;
  bool bVar1;
  undefined1 auVar2 [64];
  size_t out_elemsize;
  int out_elempack;
  int elempack;
  size_t elemsize;
  Option opt_flatten;
  Mat bottom_blob_flattened;
  int elempack_1;
  size_t elemsize_1;
  int h;
  int num_input;
  Mat *in_stack_000001e0;
  int in_stack_000001ec;
  Mat *in_stack_000001f0;
  Mat *in_stack_000001f8;
  Mat *in_stack_00000200;
  Mat *in_stack_00000208;
  Mat *in_stack_00000530;
  int in_stack_0000053c;
  Mat *in_stack_00000540;
  Mat *in_stack_00000548;
  Mat *in_stack_00000550;
  Mat *in_stack_00000558;
  int in_stack_00000564;
  Mat *in_stack_00000568;
  Mat *in_stack_00000570;
  Mat *in_stack_00000578;
  Mat *in_stack_00000580;
  Mat *in_stack_000009b0;
  int in_stack_000009bc;
  Mat *in_stack_000009c0;
  Mat *in_stack_000009c8;
  Mat *in_stack_000009d0;
  Mat *in_stack_000009d8;
  Mat *in_stack_00003c30;
  int in_stack_00003c3c;
  Mat *in_stack_00003c40;
  Mat *in_stack_00003c48;
  Mat *in_stack_00003c50;
  Mat *in_stack_00003c58;
  Option *in_stack_fffffffffffffe30;
  Mat *pMVar3;
  Allocator *in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe4c;
  int in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe54;
  int in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  Mat *in_stack_fffffffffffffe60;
  int local_168;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined1 auStack_138 [48];
  Mat local_108;
  undefined4 local_bc;
  undefined8 local_b8;
  undefined4 local_b0;
  int local_ac;
  undefined1 (*local_a8) [64];
  long *local_a0;
  int local_84;
  Mat *local_80;
  int local_60;
  undefined4 local_5c;
  Mat *local_58;
  long *local_50;
  long *local_48;
  Mat *local_38;
  void *local_30;
  long *local_20;
  long *local_18;
  int local_10;
  undefined4 local_c;
  Mat *local_8;
  
  local_ac = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) /
             *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
  local_a0 = in_RDX;
  if (((*(int *)(in_RSI + 5) == 2) && (*(int *)((long)in_RSI + 0x2c) == local_ac)) &&
     (1 < *(int *)(in_RSI + 6) * *(int *)(in_RSI + 3))) {
    local_b0 = *(undefined4 *)(in_RSI + 6);
    local_b8 = in_RSI[2];
    local_bc = *(undefined4 *)(in_RSI + 3);
    Mat::create(in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58,
                CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                in_stack_fffffffffffffe4c,in_stack_fffffffffffffe40);
    local_48 = local_a0;
    bVar1 = true;
    if (*local_a0 != 0) {
      local_20 = local_a0;
      bVar1 = local_a0[8] * (long)(int)local_a0[7] == 0;
    }
    if (bVar1) {
      local_84 = -100;
    }
    else {
      innerproduct_gemm_fp16s_sse
                (in_stack_00003c58,in_stack_00003c50,in_stack_00003c48,in_stack_00003c40,
                 in_stack_00003c3c,in_stack_00003c30,in_stack_fffffffffffffe30);
      local_84 = 0;
    }
  }
  else {
    pMVar3 = &local_108;
    local_108.data = (void *)*in_RSI;
    local_108.refcount = (int *)in_RSI[1];
    local_108.allocator = (Allocator *)in_RSI[4];
    local_108.dims = *(int *)(in_RSI + 5);
    local_108.w = *(int *)((long)in_RSI + 0x2c);
    local_108.h = *(int *)(in_RSI + 6);
    local_108.d = *(int *)((long)in_RSI + 0x34);
    local_108.c = *(int *)(in_RSI + 7);
    local_108.cstep = in_RSI[8];
    if (local_108.refcount != (int *)0x0) {
      local_c = 1;
      LOCK();
      local_10 = *local_108.refcount;
      *local_108.refcount = *local_108.refcount + 1;
      UNLOCK();
    }
    local_a8 = in_RCX;
    local_38 = pMVar3;
    local_8 = pMVar3;
    if (*(int *)(in_RSI + 5) != 1) {
      auVar2 = vmovdqu64_avx512f(*in_RCX);
      auVar2 = vmovdqu64_avx512f(auVar2);
      auStack_138 = auVar2._16_48_;
      local_148 = auVar2._0_8_;
      uStack_140 = *(undefined8 *)(*in_RCX + 0x10);
      (**(code **)(*(long *)in_RDI[1] + 0x38))((long *)in_RDI[1],in_RSI,&local_108,&local_148);
    }
    local_168 = 1;
    if (((*local_a8)[0x27] & 1) != 0) {
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 0x10 == 0) {
        local_168 = 0x10;
        in_stack_fffffffffffffe54 = local_168;
      }
      else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 8 == 0) {
        in_stack_fffffffffffffe50 = 8;
        in_stack_fffffffffffffe54 = in_stack_fffffffffffffe50;
        local_168 = in_stack_fffffffffffffe50;
      }
      else {
        in_stack_fffffffffffffe50 = 1;
        in_stack_fffffffffffffe54 = in_stack_fffffffffffffe50;
        local_168 = in_stack_fffffffffffffe50;
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 4 == 0) {
          in_stack_fffffffffffffe50 = 4;
          in_stack_fffffffffffffe54 = in_stack_fffffffffffffe50;
          local_168 = in_stack_fffffffffffffe50;
        }
      }
    }
    Mat::create(pMVar3,in_stack_fffffffffffffe5c,
                CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                in_stack_fffffffffffffe4c,in_stack_fffffffffffffe40);
    local_50 = local_a0;
    bVar1 = true;
    if (*local_a0 != 0) {
      local_18 = local_a0;
      bVar1 = local_a0[8] * (long)(int)local_a0[7] == 0;
    }
    if (bVar1) {
      local_84 = -100;
    }
    else {
      if (local_168 == 0x10) {
        innerproduct_fp16s_pack16_avx512
                  (in_stack_000009d8,in_stack_000009d0,in_stack_000009c8,in_stack_000009c0,
                   in_stack_000009bc,in_stack_000009b0,in_stack_fffffffffffffe30);
      }
      if (local_168 == 8) {
        innerproduct_fp16s_pack8_avx
                  (in_stack_00000558,in_stack_00000550,in_stack_00000548,in_stack_00000540,
                   in_stack_0000053c,in_stack_00000530,in_stack_fffffffffffffe30);
      }
      if (local_168 == 4) {
        innerproduct_fp16s_pack4_sse
                  (in_stack_00000208,in_stack_00000200,in_stack_000001f8,in_stack_000001f0,
                   in_stack_000001ec,in_stack_000001e0,in_stack_fffffffffffffe30);
      }
      if (local_168 == 1) {
        innerproduct_fp16s_sse
                  (in_stack_00000580,in_stack_00000578,in_stack_00000570,in_stack_00000568,
                   in_stack_00000564,in_stack_00000558,in_stack_fffffffffffffe30);
      }
      local_84 = 0;
    }
    pMVar3 = &local_108;
    if (local_108.refcount != (int *)0x0) {
      local_5c = 0xffffffff;
      LOCK();
      local_60 = *local_108.refcount;
      *local_108.refcount = *local_108.refcount + -1;
      UNLOCK();
      if (local_60 == 1) {
        local_80 = pMVar3;
        local_58 = pMVar3;
        if (local_108.allocator == (Allocator *)0x0) {
          local_30 = local_108.data;
          if (local_108.data != (void *)0x0) {
            free(local_108.data);
          }
        }
        else {
          (*(local_108.allocator)->_vptr_Allocator[3])(local_108.allocator,local_108.data);
        }
      }
    }
    pMVar3->data = (void *)0x0;
    pMVar3->elemsize = 0;
    pMVar3->elempack = 0;
    pMVar3->dims = 0;
    pMVar3->w = 0;
    pMVar3->h = 0;
    pMVar3->d = 0;
    pMVar3->c = 0;
    pMVar3->cstep = 0;
    pMVar3->refcount = (int *)0x0;
  }
  return local_84;
}

Assistant:

int InnerProduct_x86_avx512::forward_fp16s(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input && bottom_blob.h * bottom_blob.elempack > 1)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_fp16s_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#endif
    }
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __AVX512F__
    if (out_elempack == 16)
    {
        innerproduct_fp16s_pack16_avx512(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }
#endif // __AVX512F__

    if (out_elempack == 8)
    {
        innerproduct_fp16s_pack8_avx(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }

    if (out_elempack == 4)
    {
        innerproduct_fp16s_pack4_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }

    if (out_elempack == 1)
    {
        innerproduct_fp16s_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }

    return 0;
}